

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O3

void __thiscall deqp::egl::ColorClearThread::run(ColorClearThread *this)

{
  pointer clear;
  
  clear = (this->m_packets->
          super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>).
          _M_impl.super__Vector_impl_data._M_start;
  if (clear != (this->m_packets->
               super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>).
               _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deSemaphore_decrement(((clear->wait).m_ptr)->m_semaphore);
      (*this->m_egl->_vptr_Library[0x27])
                (this->m_egl,this->m_display,this->m_surface,this->m_surface,this->m_context);
      renderClear(this->m_api,this->m_funcs,clear->clears);
      renderClear(this->m_api,this->m_funcs,clear->clears + 1);
      finish(this->m_api,this->m_funcs);
      (*this->m_egl->_vptr_Library[0x27])(this->m_egl,this->m_display,0,0,0);
      deSemaphore_increment(((clear->signal).m_ptr)->m_semaphore);
      clear = clear + 1;
    } while (clear != (this->m_packets->
                      super__Vector_base<deqp::egl::ClearPacket,_std::allocator<deqp::egl::ClearPacket>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void run (void)
	{
		for (std::vector<ClearPacket>::const_iterator packetIter = m_packets.begin(); packetIter != m_packets.end(); packetIter++)
		{
			// Wait until it is our turn.
			packetIter->wait->decrement();

			// Acquire context.
			m_egl.makeCurrent(m_display, m_surface, m_surface, m_context);

			// Execute clears.
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(packetIter->clears); ndx++)
				renderClear(m_api, m_funcs, packetIter->clears[ndx]);

			finish(m_api, m_funcs);
			// Release context.
			m_egl.makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);

			// Signal completion.
			packetIter->signal->increment();
		}
	}